

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O0

void __thiscall
libtorrent::dht::observer::observer
          (observer *this,shared_ptr<libtorrent::dht::traversal_algorithm> *a,endpoint *ep,
          node_id *id)

{
  node_id *id_local;
  endpoint *ep_local;
  shared_ptr<libtorrent::dht::traversal_algorithm> *a_local;
  observer *this_local;
  
  ::std::enable_shared_from_this<libtorrent::dht::observer>::enable_shared_from_this
            (&this->super_enable_shared_from_this<libtorrent::dht::observer>);
  this->_vptr_observer = (_func_int **)&PTR__observer_00b96b10;
  ::std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->m_sent);
  ::std::shared_ptr<libtorrent::dht::traversal_algorithm>::shared_ptr(&this->m_algorithm,a);
  *(undefined8 *)(this->m_id).m_number._M_elems = *(undefined8 *)(id->m_number)._M_elems;
  *(undefined8 *)((this->m_id).m_number._M_elems + 2) = *(undefined8 *)((id->m_number)._M_elems + 2)
  ;
  (this->m_id).m_number._M_elems[4] = (id->m_number)._M_elems[4];
  this->m_port = 0;
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>::
  bitfield_flag(&this->flags);
  set_target(this,ep);
  return;
}

Assistant:

observer(std::shared_ptr<traversal_algorithm> a
		, udp::endpoint const& ep, node_id const& id)
		: m_algorithm(std::move(a))
		, m_id(id)
	{
		TORRENT_ASSERT(!m_was_sent);
		TORRENT_ASSERT(m_algorithm);
		set_target(ep);
	}